

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void SerializeMany<ParamsStream<HashedSourceWriter<AutoFile>&,CAddress::SerParams>,CAddress,CNetAddr,Wrapper<ChronoFormatter<long,false>,std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>const&>,int>
               (ParamsStream<HashedSourceWriter<AutoFile>_&,_CAddress::SerParams> *s,CAddress *args,
               CNetAddr *args_1,
               Wrapper<ChronoFormatter<long,_false>,_const_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_&>
               *args_2,int *args_3)

{
  long lVar1;
  long in_FS_OFFSET;
  ParamsStream<HashedSourceWriter<AutoFile>_&,_CAddress::SerParams> *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Serialize<ParamsStream<HashedSourceWriter<AutoFile>_&,_CAddress::SerParams>,_CAddress>
            (in_stack_ffffffffffffffc8,(CAddress *)0x8a08fe);
  Serialize<ParamsStream<HashedSourceWriter<AutoFile>_&,_CAddress::SerParams>,_CNetAddr>
            (in_stack_ffffffffffffffc8,(CNetAddr *)0x8a090d);
  Serialize<ParamsStream<HashedSourceWriter<AutoFile>_&,_CAddress::SerParams>,_Wrapper<ChronoFormatter<long,_false>,_const_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_&>_>
            (in_stack_ffffffffffffffc8,
             (Wrapper<ChronoFormatter<long,_false>,_const_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_&>
              *)0x8a091c);
  Serialize<ParamsStream<HashedSourceWriter<AutoFile>&,CAddress::SerParams>>
            (in_stack_ffffffffffffffc8,0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeMany(Stream& s, const Args&... args)
{
    (::Serialize(s, args), ...);
}